

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_mode_search_utils.h
# Opt level: O0

void highbd_compute_gradient_info_sb(MACROBLOCK *x,BLOCK_SIZE sb_size,PLANE_TYPE plane)

{
  byte bVar1;
  int iVar2;
  undefined4 uVar3;
  int iVar4;
  int dx_00;
  int dy_00;
  int iVar5;
  long lVar6;
  ushort *puVar7;
  ushort *puVar8;
  ushort *puVar9;
  ushort *puVar10;
  int iVar11;
  byte in_DL;
  byte in_SIL;
  long in_RDI;
  int dy;
  int dx;
  uint16_t *right;
  uint16_t *left;
  uint16_t *below;
  uint16_t *above;
  int c;
  int r;
  int sb_width;
  int sb_height;
  int ss_y;
  int ss_x;
  int stride;
  uint16_t *src;
  PixelLevelGradientInfo *grad_info_sb;
  undefined1 local_6c;
  int local_3c;
  int local_38;
  long local_20;
  
  lVar6 = *(long *)(in_RDI + 0x1f6b8) + (long)(int)((uint)in_DL << 0xe) * 4;
  iVar2 = *(int *)(in_RDI + (ulong)in_DL * 0x88 + 0x48);
  uVar3 = *(undefined4 *)(in_RDI + (ulong)in_DL * 0xa30 + 0x1b8);
  bVar1 = block_size_high[in_SIL];
  iVar4 = (int)(uint)block_size_wide[in_SIL] >>
          ((byte)*(undefined4 *)(in_RDI + (ulong)in_DL * 0xa30 + 0x1b4) & 0x1f);
  local_20 = *(long *)(in_RDI + (ulong)in_DL * 0x88 + 0x30) * 2 + (long)iVar2 * 2;
  for (local_38 = 1; local_38 < ((int)(uint)bVar1 >> ((byte)uVar3 & 0x1f)) + -1;
      local_38 = local_38 + 1) {
    for (local_3c = 1; local_3c < iVar4 + -1; local_3c = local_3c + 1) {
      puVar7 = (ushort *)(local_20 + (long)(local_3c - iVar2) * 2);
      puVar8 = (ushort *)(local_20 + (long)(local_3c + iVar2) * 2);
      puVar9 = (ushort *)(local_20 + (long)(local_3c + -1) * 2);
      puVar10 = (ushort *)(local_20 + (long)(local_3c + 1) * 2);
      dx_00 = ((uint)puVar10[-iVar2] + (uint)*puVar10 * 2 + (uint)puVar10[iVar2]) -
              ((uint)puVar9[-iVar2] + (uint)*puVar9 * 2 + (uint)puVar9[iVar2]);
      dy_00 = ((uint)puVar8[-1] + (uint)*puVar8 * 2 + (uint)puVar8[1]) -
              ((uint)puVar7[-1] + (uint)*puVar7 * 2 + (uint)puVar7[1]);
      *(bool *)(lVar6 + 3 + (long)(local_38 * iVar4 + local_3c) * 4) = dx_00 == 0;
      iVar5 = dx_00;
      if (dx_00 < 1) {
        iVar5 = -dx_00;
      }
      iVar11 = dy_00;
      if (dy_00 < 1) {
        iVar11 = -dy_00;
      }
      *(short *)(lVar6 + (long)(local_38 * iVar4 + local_3c) * 4) = (short)iVar5 + (short)iVar11;
      if (dx_00 == 0) {
        local_6c = 0xff;
      }
      else {
        iVar5 = get_hist_bin_idx(dx_00,dy_00);
        local_6c = (undefined1)iVar5;
      }
      *(undefined1 *)(lVar6 + 2 + (long)(local_38 * iVar4 + local_3c) * 4) = local_6c;
    }
    local_20 = local_20 + (long)iVar2 * 2;
  }
  return;
}

Assistant:

static inline void highbd_compute_gradient_info_sb(MACROBLOCK *const x,
                                                   BLOCK_SIZE sb_size,
                                                   PLANE_TYPE plane) {
  PixelLevelGradientInfo *const grad_info_sb =
      x->pixel_gradient_info + plane * MAX_SB_SQUARE;
  const uint16_t *src = CONVERT_TO_SHORTPTR(x->plane[plane].src.buf);
  const int stride = x->plane[plane].src.stride;
  const int ss_x = x->e_mbd.plane[plane].subsampling_x;
  const int ss_y = x->e_mbd.plane[plane].subsampling_y;
  const int sb_height = block_size_high[sb_size] >> ss_y;
  const int sb_width = block_size_wide[sb_size] >> ss_x;
  src += stride;
  for (int r = 1; r < sb_height - 1; ++r) {
    for (int c = 1; c < sb_width - 1; ++c) {
      const uint16_t *above = &src[c - stride];
      const uint16_t *below = &src[c + stride];
      const uint16_t *left = &src[c - 1];
      const uint16_t *right = &src[c + 1];
      // Calculate gradient using Sobel filters.
      const int dx = (right[-stride] + 2 * right[0] + right[stride]) -
                     (left[-stride] + 2 * left[0] + left[stride]);
      const int dy = (below[-1] + 2 * below[0] + below[1]) -
                     (above[-1] + 2 * above[0] + above[1]);
      grad_info_sb[r * sb_width + c].is_dx_zero = (dx == 0);
      grad_info_sb[r * sb_width + c].abs_dx_abs_dy_sum =
          (uint16_t)(abs(dx) + abs(dy));
      grad_info_sb[r * sb_width + c].hist_bin_idx =
          (dx != 0) ? get_hist_bin_idx(dx, dy) : -1;
    }
    src += stride;
  }
}